

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_14::NameResolver::ResolveLocalVar(NameResolver *this,Var *var)

{
  bool bVar1;
  Index index_00;
  undefined8 uVar2;
  Index index;
  Var *var_local;
  NameResolver *this_local;
  
  bVar1 = Var::is_name(var);
  if ((bVar1) && (this->current_func_ != (Func *)0x0)) {
    index_00 = Func::GetLocalIndex(this->current_func_,var);
    if (index_00 == 0xffffffff) {
      Var::name_abi_cxx11_(var);
      uVar2 = std::__cxx11::string::c_str();
      PrintError(this,&var->loc,"undefined local variable \"%s\"",uVar2);
    }
    else {
      Var::set_index(var,index_00);
    }
  }
  return;
}

Assistant:

void NameResolver::ResolveLocalVar(Var* var) {
  if (var->is_name()) {
    if (!current_func_) {
      return;
    }

    Index index = current_func_->GetLocalIndex(*var);
    if (index == kInvalidIndex) {
      PrintError(&var->loc, "undefined local variable \"%s\"",
                 var->name().c_str());
      return;
    }

    var->set_index(index);
  }
}